

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_names.cc
# Opt level: O3

bool prometheus::CheckLabelName(string *name,MetricType type)

{
  char *pcVar1;
  char cVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  
  bVar4 = anon_unknown_3::nameStartsValid(name);
  if ((!bVar4) ||
     (((type == Summary || (type == Histogram)) &&
      (iVar5 = std::__cxx11::string::compare((char *)name), iVar5 == 0)))) {
    return false;
  }
  pcVar8 = (name->_M_dataplus)._M_p;
  uVar3 = name->_M_string_length;
  pcVar1 = pcVar8 + uVar3;
  pcVar6 = pcVar8;
  if (0 < (long)uVar3 >> 2) {
    pcVar6 = pcVar8 + (uVar3 & 0xfffffffffffffffc);
    lVar7 = ((long)uVar3 >> 2) + 1;
    pcVar8 = pcVar8 + 3;
    do {
      cVar2 = pcVar8[-3];
      if ((0x19 < (byte)(cVar2 + 0x9fU) && 9 < (byte)(cVar2 - 0x30U)) &&
         (cVar2 != '_' && (byte)(cVar2 + 0xa5U) < 0xe6)) {
        pcVar8 = pcVar8 + -3;
        goto LAB_0012953b;
      }
      cVar2 = pcVar8[-2];
      if ((0x19 < (byte)(cVar2 + 0x9fU) && 9 < (byte)(cVar2 - 0x30U)) &&
         (cVar2 != '_' && (byte)(cVar2 + 0xa5U) < 0xe6)) {
        pcVar8 = pcVar8 + -2;
        goto LAB_0012953b;
      }
      cVar2 = pcVar8[-1];
      if ((0x19 < (byte)(cVar2 + 0x9fU) && 9 < (byte)(cVar2 - 0x30U)) &&
         (cVar2 != '_' && (byte)(cVar2 + 0xa5U) < 0xe6)) {
        pcVar8 = pcVar8 + -1;
        goto LAB_0012953b;
      }
      cVar2 = *pcVar8;
      if ((0x19 < (byte)(cVar2 + 0x9fU) && 9 < (byte)(cVar2 - 0x30U)) &&
         (cVar2 != '_' && (byte)(cVar2 + 0xa5U) < 0xe6)) goto LAB_0012953b;
      lVar7 = lVar7 + -1;
      pcVar8 = pcVar8 + 4;
    } while (1 < lVar7);
  }
  lVar7 = (long)pcVar1 - (long)pcVar6;
  if (lVar7 != 1) {
    pcVar8 = pcVar6;
    if (lVar7 != 2) {
      pcVar8 = pcVar1;
      if ((lVar7 != 3) ||
         ((cVar2 = *pcVar6, 0x19 < (byte)(cVar2 + 0x9fU) && 9 < (byte)(cVar2 - 0x30U) &&
          (pcVar8 = pcVar6, cVar2 != '_' && (byte)(cVar2 + 0xa5U) < 0xe6)))) goto LAB_0012953b;
      pcVar8 = pcVar6 + 1;
    }
    cVar2 = *pcVar8;
    if ((0x19 < (byte)(cVar2 + 0x9fU) && 9 < (byte)(cVar2 - 0x30U)) &&
       (cVar2 != '_' && (byte)(cVar2 + 0xa5U) < 0xe6)) goto LAB_0012953b;
    pcVar6 = pcVar8 + 1;
  }
  cVar2 = *pcVar6;
  pcVar8 = pcVar1;
  if ((0x19 < (byte)(cVar2 + 0x9fU) && 9 < (byte)(cVar2 - 0x30U)) &&
     (pcVar8 = pcVar6, cVar2 == '_' || 0xe5 < (byte)(cVar2 + 0xa5U))) {
    pcVar8 = pcVar1;
  }
LAB_0012953b:
  return pcVar8 == pcVar1;
}

Assistant:

bool CheckLabelName(const std::string& name, MetricType type) {
  if (!nameStartsValid(name)) {
    return false;
  }

  auto validLabelCharacters = [](char c) {
    return isLocaleIndependentAlphaNumeric(c) || c == '_';
  };

  if ((type == MetricType::Histogram && name == "le") ||
      (type == MetricType::Summary && name == "quantile")) {
    return false;
  }

  auto mismatch =
      std::find_if_not(std::begin(name), std::end(name), validLabelCharacters);
  return mismatch == std::end(name);
}